

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

int __thiscall smf::MidiMessage::getVelocity(MidiMessage *this)

{
  pointer puVar1;
  bool bVar2;
  uint uVar3;
  
  bVar2 = isNote(this);
  uVar3 = 0xffffffff;
  if ((bVar2) &&
     (puVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
     2 < (ulong)((long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar1))) {
    uVar3 = (uint)puVar1[2];
  }
  return uVar3;
}

Assistant:

int MidiMessage::getVelocity(void) const {
	if (isNote()) {
		int output = getP2();
		if (output < 0) {
			return output;
		} else {
			return 0xff & output;
		}
	} else {
		return -1;
	}
}